

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_config.c
# Opt level: O0

int mpt_parse_config(mpt_input_parser_t next,void *npar,mpt_parser_context *parse,
                    mpt_path_handler_t save,void *ctx)

{
  int iVar1;
  mpt_value *local_90;
  uint local_74;
  undefined1 auStack_70 [4];
  int ret;
  mpt_value val;
  iovec vec;
  mpt_path path;
  void *ctx_local;
  mpt_path_handler_t save_local;
  mpt_parser_context *parse_local;
  void *npar_local;
  mpt_input_parser_t next_local;
  
  vec.iov_len = 0;
  _auStack_70 = &val._type;
  val._addr = (void *)0x43;
  do {
    local_74 = (*next)(npar,parse,(mpt_path *)&vec.iov_len);
    if ((int)local_74 < 1) {
LAB_00125060:
      mpt_path_fini((mpt_path *)&vec.iov_len);
      return local_74;
    }
    val._type = vec.iov_len;
    vec.iov_base = (void *)(ulong)parse->valid;
    if ((local_74 & 4) == 0) {
      local_90 = (mpt_value *)0x0;
    }
    else {
      local_90 = (mpt_value *)auStack_70;
    }
    iVar1 = (*save)(ctx,(mpt_path *)&vec.iov_len,local_90,(int)parse->prev,local_74);
    if (iVar1 < 0) {
      local_74 = 0xffffff80;
      goto LAB_00125060;
    }
    if ((local_74 & 2) == 0) {
      local_74 = mpt_path_invalidate((mpt_path *)&vec.iov_len);
    }
    else {
      local_74 = mpt_path_del((mpt_path *)&vec.iov_len);
    }
    if ((int)local_74 < 0) {
      local_74 = 0xfffffff0;
      goto LAB_00125060;
    }
    parse->prev = parse->curr;
    parse->curr = '\0';
    parse->valid = 0;
  } while( true );
}

Assistant:

extern int mpt_parse_config(MPT_TYPE(input_parser) next, void *npar, MPT_STRUCT(parser_context) *parse, MPT_TYPE(path_handler) save, void *ctx)
{
	MPT_STRUCT(path) path = MPT_PATH_INIT;
	struct iovec vec;
	MPT_STRUCT(value) val = MPT_VALUE_INIT(MPT_type_toVector('c'), &vec);
	int ret;
	
	/* accuire next path element */
	while ((ret = next(npar, parse, &path)) > 0) {
		vec.iov_base = (char *) (path.base + path.off + path.len);
		vec.iov_len  = parse->valid;
		
		/* save to configuration */
		if (save(ctx, &path, ret & MPT_PARSEFLAG(Data) ? &val : 0, parse->prev, ret) < 0) {
			ret = -0x80;
			break;
		}
		/* remove last path element or trailing data */
		if (ret & MPT_PARSEFLAG(SectEnd)) {
			ret = mpt_path_del(&path);
		} else {
			ret = mpt_path_invalidate(&path);
		}
		if (ret < 0) {
			ret = MPT_ERROR(MissingData);
			break;
		}
		/* cycle parse state */
		parse->prev = parse->curr;
		parse->curr = 0;
		
		/* reset valid post path size */
		parse->valid = 0;
	}
	mpt_path_fini(&path);
	
	return ret;
}